

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O2

uint64 __thiscall
libebml::EbmlVoid::ReplaceWith
          (EbmlVoid *this,EbmlElement *EltToReplaceWith,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined7 in_register_00000081;
  uint64 uVar6;
  EbmlVoid aTmp;
  EbmlBinary local_70;
  
  uVar6 = 0;
  (*EltToReplaceWith->_vptr_EbmlElement[8])
            (EltToReplaceWith,CONCAT71(in_register_00000081,bWithDefault) & 0xffffffff,0);
  bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
  iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  iVar4 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
  bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
  if ((ulong)bVar2 + CONCAT44(extraout_var_00,iVar4) <= CONCAT44(extraout_var,iVar3) + (ulong)bVar1)
  {
    bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
    iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    iVar4 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
    bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
    if ((CONCAT44(extraout_var_01,iVar3) + (ulong)bVar1) -
        ((ulong)bVar2 + CONCAT44(extraout_var_02,iVar4)) == 1) {
      uVar6 = 0;
    }
    else {
      iVar3 = (*output->_vptr_IOCallback[5])(output);
      (*output->_vptr_IOCallback[3])
                (output,(this->super_EbmlBinary).super_EbmlElement.ElementPosition,0);
      EbmlElement::Render(EltToReplaceWith,output,bWithDefault,false,false);
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
      bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
      if (1 < (CONCAT44(extraout_var_04,iVar4) + (ulong)bVar1) -
              ((ulong)bVar2 + CONCAT44(extraout_var_05,iVar5))) {
        EbmlVoid((EbmlVoid *)&local_70);
        bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
        bVar2 = EbmlElement::HeadSize(EltToReplaceWith);
        local_70.super_EbmlElement.Size =
             ~(CONCAT44(extraout_var_07,iVar5) + (ulong)bVar2) +
             CONCAT44(extraout_var_06,iVar4) + (ulong)bVar1;
        bVar1 = EbmlElement::HeadSize(&local_70.super_EbmlElement);
        uVar6 = local_70.super_EbmlElement.Size;
        iVar4 = CodedSizeLength(local_70.super_EbmlElement.Size,
                                local_70.super_EbmlElement.SizeLength,
                                local_70.super_EbmlElement.bSizeIsFinite);
        local_70.super_EbmlElement.Size = uVar6 - (long)iVar4;
        bVar2 = EbmlElement::HeadSize(&local_70.super_EbmlElement);
        if (bVar1 != bVar2) {
          iVar4 = CodedSizeLength(local_70.super_EbmlElement.Size,
                                  local_70.super_EbmlElement.SizeLength,
                                  local_70.super_EbmlElement.bSizeIsFinite);
          local_70.super_EbmlElement.SizeLength = ((uint)bVar1 - (uint)bVar2) + iVar4;
        }
        EbmlElement::RenderHead(&local_70.super_EbmlElement,output,false,bWithDefault,false);
        EbmlBinary::~EbmlBinary(&local_70);
      }
      if (ComeBackAfterward) {
        (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var_03,iVar3),0);
      }
      iVar3 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      uVar6 = (ulong)bVar1 + CONCAT44(extraout_var_08,iVar3);
    }
  }
  return uVar6;
}

Assistant:

uint64 EbmlVoid::ReplaceWith(EbmlElement & EltToReplaceWith, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  EltToReplaceWith.UpdateSize(bWithDefault);
  if (HeadSize() + GetSize() < EltToReplaceWith.GetSize() + EltToReplaceWith.HeadSize()) {
    // the element can't be written here !
    return INVALID_FILEPOS_T;
  }
  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() == 1) {
    // there is not enough space to put a filling element
    return INVALID_FILEPOS_T;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(GetElementPosition());
  EltToReplaceWith.Render(output, bWithDefault);

  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() > 1) {
    // fill the rest with another void element
    EbmlVoid aTmp;
    aTmp.SetSize_(HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() - 1); // 1 is the length of the Void ID
    int HeadBefore = aTmp.HeadSize();
    aTmp.SetSize_(aTmp.GetSize() - CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()));
    int HeadAfter = aTmp.HeadSize();
    if (HeadBefore != HeadAfter) {
      aTmp.SetSizeLength(CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()) - (HeadAfter - HeadBefore));
    }
    aTmp.RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return GetSize() + HeadSize();
}